

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi_p.h
# Opt level: O0

BufferOp *
QRhiResourceUpdateBatchPrivate::BufferOp::dynamicUpdate
          (QRhiBuffer *buf,quint32 offset,QByteArray *data)

{
  long lVar1;
  BufferOp *in_RCX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  quint32 offset_00;
  BufferOp *in_RDI;
  long in_FS_OFFSET;
  BufferOp *op;
  BufferOp *data_00;
  uint3 in_stack_ffffffffffffffbc;
  uint uVar2;
  BufferOp *op_00;
  
  offset_00 = (quint32)((ulong)in_RSI >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = (uint)in_stack_ffffffffffffffbc;
  data_00 = in_RDI;
  op_00 = in_RCX;
  memset(in_RDI,0xaa,0x30);
  memset(data_00,0,0x30);
  QRhiBufferData::QRhiBufferData(&data_00->data);
  QByteArray::QByteArray((QByteArray *)in_RCX,(QByteArray *)in_RDI);
  changeToDynamicUpdate(op_00,(QRhiBuffer *)CONCAT44(uVar2,in_EDX),offset_00,(QByteArray *)data_00);
  QByteArray::~QByteArray((QByteArray *)0x69b450);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

static BufferOp dynamicUpdate(QRhiBuffer *buf, quint32 offset, QByteArray data)
        {
            BufferOp op = {};
            changeToDynamicUpdate(&op, buf, offset, std::move(data));
            return op;
        }